

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void MirrorUVRow_C(uint8_t *src_uv,uint8_t *dst_uv,int width)

{
  int x;
  int width_local;
  uint8_t *dst_uv_local;
  uint8_t *src_uv_local;
  
  src_uv_local = src_uv + (width + -1) * 2;
  dst_uv_local = dst_uv;
  for (x = 0; x < width; x = x + 1) {
    *dst_uv_local = *src_uv_local;
    dst_uv_local[1] = src_uv_local[1];
    src_uv_local = src_uv_local + -2;
    dst_uv_local = dst_uv_local + 2;
  }
  return;
}

Assistant:

void MirrorUVRow_C(const uint8_t* src_uv, uint8_t* dst_uv, int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width; ++x) {
    dst_uv[0] = src_uv[0];
    dst_uv[1] = src_uv[1];
    src_uv -= 2;
    dst_uv += 2;
  }
}